

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<void,chaiscript::dispatch::Assignable_Proxy_Function&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
               (_func_void_Assignable_Proxy_Function_ptr_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  size_t t_i;
  Boxed_Value *pBVar1;
  bad_boxed_cast *anon_var_0;
  size_t local_30;
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_void_Assignable_Proxy_Function_ptr_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
  *param_0_local;
  
  local_30 = 1;
  i = (size_type)t_conversions;
  t_conversions_local = (Type_Conversions_State *)params;
  params_local = (Function_Params *)param_1;
  pBVar1 = Function_Params::operator[](params,0);
  boxed_cast<chaiscript::dispatch::Assignable_Proxy_Function&>(pBVar1,(Type_Conversions_State *)i);
  t_i = local_30;
  local_30 = local_30 + 1;
  pBVar1 = Function_Params::operator[]((Function_Params *)t_conversions_local,t_i);
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            ((chaiscript *)&anon_var_0,pBVar1,(Type_Conversions_State *)i);
  Catch::clara::std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)&anon_var_0);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }